

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_sparse_bit_array.cpp
# Opt level: O3

int __thiscall
crnlib::sparse_bit_array::find_first_set_bit(sparse_bit_array *this,uint index,uint num)

{
  uint c;
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint32 uVar5;
  long lVar6;
  bool bVar7;
  
  if (num != 0) {
    uVar4 = index & 0x1ff;
    if (num < 0x201 || uVar4 != 0) {
      do {
        uVar2 = 0x20 - (index & 0x1f);
        if (num <= uVar2) {
          uVar2 = num;
        }
        if ((this->m_ppGroups[index >> 9] != (uint32 *)0x0) &&
           (uVar4 = (0xffffffffU >> (-(char)uVar2 & 0x1fU)) << (sbyte)(index & 0x1f) &
                    this->m_ppGroups[index >> 9][uVar4 >> 5], uVar4 != 0)) {
          iVar3 = 0x20;
          lVar6 = 4;
          do {
            if ((*(uint *)(math::count_trailing_zero_bits(unsigned_int)::B + lVar6 * 4) & uVar4) !=
                0) {
              uVar4 = uVar4 << ((byte)*(int *)(math::count_trailing_zero_bits(unsigned_int)::S +
                                              lVar6 * 4) & 0x1f);
              iVar3 = iVar3 - *(int *)(math::count_trailing_zero_bits(unsigned_int)::S + lVar6 * 4);
            }
            bVar7 = lVar6 != 0;
            lVar6 = lVar6 + -1;
          } while (bVar7);
          iVar3 = iVar3 + (index & 0xffffffe0);
          goto LAB_00147eb0;
        }
        num = num - uVar2;
        if (num == 0) {
          return -1;
        }
        index = uVar2 + index;
        uVar4 = index & 0x1ff;
      } while (num < 0x201 || uVar4 != 0);
    }
    iVar3 = -index;
    do {
      if (this->m_ppGroups[index >> 9] != (uint32 *)0x0) {
        lVar6 = 0;
        iVar1 = iVar3;
        do {
          uVar5 = this->m_ppGroups[index >> 9][lVar6];
          if (uVar5 != 0) {
            iVar3 = 0x20;
            lVar6 = 4;
            do {
              if ((*(uint *)(math::count_trailing_zero_bits(unsigned_int)::B + lVar6 * 4) & uVar5)
                  != 0) {
                uVar5 = uVar5 << ((byte)*(int *)(math::count_trailing_zero_bits(unsigned_int)::S +
                                                lVar6 * 4) & 0x1f);
                iVar3 = iVar3 - *(int *)(math::count_trailing_zero_bits(unsigned_int)::S + lVar6 * 4
                                        );
              }
              bVar7 = lVar6 != 0;
              lVar6 = lVar6 + -1;
            } while (bVar7);
            return (iVar3 + -1 + (uint)(uVar5 == 0)) - iVar1;
          }
          lVar6 = lVar6 + 1;
          iVar1 = iVar1 + -0x20;
        } while (lVar6 != 0x10);
      }
      num = num - 0x200;
      index = index + 0x200;
      iVar3 = iVar3 + -0x200;
    } while (0x1ff < num);
    if (num != 0) {
      do {
        uVar2 = 0x20;
        if (num < 0x20) {
          uVar2 = num;
        }
        if ((this->m_ppGroups[index >> 9] != (uint32 *)0x0) &&
           (uVar4 = (0xffffffffU >> (-(char)uVar2 & 0x1fU)) << ((byte)index & 0x1f) &
                    *(uint *)((long)this->m_ppGroups[index >> 9] + (ulong)(index >> 3 & 0x3c)),
           uVar4 != 0)) {
          iVar3 = 0x20;
          lVar6 = 4;
          do {
            if ((*(uint *)(math::count_trailing_zero_bits(unsigned_int)::B + lVar6 * 4) & uVar4) !=
                0) {
              uVar4 = uVar4 << ((byte)*(int *)(math::count_trailing_zero_bits(unsigned_int)::S +
                                              lVar6 * 4) & 0x1f);
              iVar3 = iVar3 - *(int *)(math::count_trailing_zero_bits(unsigned_int)::S + lVar6 * 4);
            }
            bVar7 = lVar6 != 0;
            lVar6 = lVar6 + -1;
          } while (bVar7);
          iVar3 = iVar3 + (index & 0xffffffe0);
LAB_00147eb0:
          return iVar3 + -1 + (uint)(uVar4 == 0);
        }
        index = index + uVar2;
        num = num - uVar2;
      } while (num != 0);
    }
  }
  return -1;
}

Assistant:

int sparse_bit_array::find_first_set_bit(uint index, uint num) const
    {
        CRNLIB_ASSERT((index + num) <= (m_num_groups << cBitsPerGroupShift));

        if (!num)
        {
            return -1;
        }

        while ((index & cBitsPerGroupMask) || (num <= cBitsPerGroup))
        {
            uint group_index = index >> cBitsPerGroupShift;
            CRNLIB_ASSERT(group_index < m_num_groups);

            const uint group_bit_ofs = index & cBitsPerGroupMask;
            const uint dword_bit_ofs = group_bit_ofs & 31;

            const uint max_bits_to_examine = 32 - dword_bit_ofs;
            const uint bits_to_examine = math::minimum(max_bits_to_examine, num);

            uint32* pGroup = m_ppGroups[group_index];
            if (pGroup)
            {
                const uint32 msk = (0xFFFFFFFFU >> (32 - bits_to_examine));

                uint bits = pGroup[group_bit_ofs >> 5] & (msk << dword_bit_ofs);
                if (bits)
                {
                    uint num_trailing_zeros = math::count_trailing_zero_bits(bits);
                    int set_index = num_trailing_zeros + (index & ~31);
                    CRNLIB_ASSERT(get_bit(set_index));
                    return set_index;
                }
            }

            num -= bits_to_examine;
            if (!num)
            {
                return -1;
            }

            index += bits_to_examine;
        }

        while (num >= cBitsPerGroup)
        {
            uint group_index = index >> cBitsPerGroupShift;
            CRNLIB_ASSERT(group_index < m_num_groups);

            uint32* pGroup = m_ppGroups[group_index];
            if (pGroup)
            {
                for (uint i = 0; i < cDWORDsPerGroup; i++)
                {
                    uint32 bits = pGroup[i];
                    if (bits)
                    {
                        uint num_trailing_zeros = math::count_trailing_zero_bits(bits);

                        int set_index = num_trailing_zeros + index + (i << 5);
                        CRNLIB_ASSERT(get_bit(set_index));
                        return set_index;
                    }
                }
            }

            num -= cBitsPerGroup;
            index += cBitsPerGroup;
        }

        while (num)
        {
            uint group_index = index >> cBitsPerGroupShift;
            CRNLIB_ASSERT(group_index < m_num_groups);

            uint bits_to_examine = math::minimum(32U, num);

            uint32* pGroup = m_ppGroups[group_index];
            if (pGroup)
            {
                uint group_bit_ofs = index & cBitsPerGroupMask;

                uint32 msk = (0xFFFFFFFFU >> (32 - bits_to_examine));

                uint32 bits = pGroup[group_bit_ofs >> 5] & (msk << (group_bit_ofs & 31));
                if (bits)
                {
                    uint num_trailing_zeros = math::count_trailing_zero_bits(bits);

                    int set_index = num_trailing_zeros + (index & ~31);
                    CRNLIB_ASSERT(get_bit(set_index));
                    return set_index;
                }
            }

            num -= bits_to_examine;
            index += bits_to_examine;
        }

        return -1;
    }